

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.cxx
# Opt level: O3

bool __thiscall
cmQTWrapCPPCommand::InitialPass
          (cmQTWrapCPPCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  size_type sVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  cmSourceFile *this_01;
  cmSourceFile *this_02;
  string *def;
  ulong uVar6;
  string *sourceName;
  char *__end;
  string no_main_dependency;
  string sourceListValue;
  allocator local_119;
  string hname;
  string srcName;
  string newName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  cmCustomCommandLine commandLine;
  
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &sourceListValue.field_2;
  sourceListValue._M_dataplus._M_p = (pointer)paVar1;
  if (uVar6 < 0x41) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sourceListValue,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&sourceListValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p == paVar1) goto LAB_002c9434;
  }
  else {
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sourceListValue,"QT_MOC_EXECUTABLE","");
    pcVar4 = cmMakefile::GetRequiredDefinition(this_00,&sourceListValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p != paVar1) {
      operator_delete(sourceListValue._M_dataplus._M_p,
                      sourceListValue.field_2._M_allocated_capacity + 1);
    }
    def = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start + 1;
    pcVar5 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,def);
    std::__cxx11::string::string((string *)&sourceListValue,pcVar5,(allocator *)&srcName);
    sourceName = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2;
    if (sourceName !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        this_01 = cmMakefile::GetSource((this->super_cmCommand).Makefile,sourceName);
        if (this_01 == (cmSourceFile *)0x0) {
LAB_002c8efe:
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&srcName,sourceName);
          pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&newName,pcVar5,(allocator *)&hname);
          std::__cxx11::string::append((char *)&newName);
          std::__cxx11::string::_M_append((char *)&newName,(ulong)srcName._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&newName);
          this_02 = cmMakefile::GetOrCreateSource((this->super_cmCommand).Makefile,&newName,true);
          if (this_01 != (cmSourceFile *)0x0) {
            hname._M_dataplus._M_p = (pointer)&hname.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&hname,"ABSTRACT","");
            no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&no_main_dependency,"ABSTRACT","");
            pcVar5 = cmSourceFile::GetProperty(this_01,&no_main_dependency);
            cmSourceFile::SetProperty(this_02,&hname,pcVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
              operator_delete(no_main_dependency._M_dataplus._M_p,
                              no_main_dependency.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)hname._M_dataplus._M_p != &hname.field_2) {
              operator_delete(hname._M_dataplus._M_p,
                              CONCAT71(hname.field_2._M_allocated_capacity._1_7_,
                                       hname.field_2._M_local_buf[0]) + 1);
            }
          }
          hname._M_dataplus._M_p = (pointer)&hname.field_2;
          hname._M_string_length = 0;
          hname.field_2._M_local_buf[0] = '\0';
          bVar3 = cmsys::SystemTools::FileIsFullPath((sourceName->_M_dataplus)._M_p);
          if (bVar3) {
            std::__cxx11::string::_M_assign((string *)&hname);
          }
          else {
            if (this_01 == (cmSourceFile *)0x0) {
LAB_002c90d5:
              pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
            }
            else {
              no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&no_main_dependency,"GENERATED","");
              bVar3 = cmSourceFile::GetPropertyAsBool(this_01,&no_main_dependency);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
                operator_delete(no_main_dependency._M_dataplus._M_p,
                                no_main_dependency.field_2._M_allocated_capacity + 1);
              }
              if (!bVar3) goto LAB_002c90d5;
              pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            }
            sVar2 = hname._M_string_length;
            strlen(pcVar5);
            std::__cxx11::string::_M_replace((ulong)&hname,0,(char *)sVar2,(ulong)pcVar5);
            std::__cxx11::string::append((char *)&hname);
            std::__cxx11::string::_M_append((char *)&hname,(ulong)(sourceName->_M_dataplus)._M_p);
          }
          if (sourceListValue._M_string_length != 0) {
            std::__cxx11::string::append((char *)&sourceListValue);
          }
          std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)newName._M_dataplus._M_p);
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string
                    ((string *)&no_main_dependency,pcVar4,(allocator *)&commandLines);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-o","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&commandLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&newName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&commandLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&hname);
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     (value_type *)
                     &commandLine.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&no_main_dependency,pcVar4,&local_119);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     &no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&hname);
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"");
          cmMakefile::AddCustomCommandToOutput
                    ((this->super_cmCommand).Makefile,&newName,&depends,&no_main_dependency,
                     &commandLines,"Qt Wrapped File",(char *)0x0,false,true,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&depends);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&commandLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)hname._M_dataplus._M_p != &hname.field_2) {
            operator_delete(hname._M_dataplus._M_p,
                            CONCAT71(hname.field_2._M_allocated_capacity._1_7_,
                                     hname.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)newName._M_dataplus._M_p != &newName.field_2) {
            operator_delete(newName._M_dataplus._M_p,newName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)srcName._M_dataplus._M_p != &srcName.field_2) {
            operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          srcName._M_dataplus._M_p = (pointer)&srcName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&srcName,"WRAP_EXCLUDE","");
          bVar3 = cmSourceFile::GetPropertyAsBool(this_01,&srcName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)srcName._M_dataplus._M_p != &srcName.field_2) {
            operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
          }
          if (!bVar3) goto LAB_002c8efe;
        }
        sourceName = sourceName + 1;
      } while (sourceName !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,def,sourceListValue._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p == &sourceListValue.field_2) goto LAB_002c9434;
  }
  operator_delete(sourceListValue._M_dataplus._M_p,sourceListValue.field_2._M_allocated_capacity + 1
                 );
LAB_002c9434:
  return 0x40 < uVar6;
}

Assistant:

bool cmQTWrapCPPCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus &)
{
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Get the moc executable to run in the custom command.
  const char* moc_exe =
    this->Makefile->GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& sourceList = args[1];
  std::string sourceListValue =
    this->Makefile->GetSafeDefinition(sourceList);

  // Create a rule for all sources listed.
  for(std::vector<std::string>::const_iterator j = (args.begin() + 2);
      j != args.end(); ++j)
    {
    cmSourceFile *curr = this->Makefile->GetSource(*j);
    // if we should wrap the class
    if(!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE")))
      {
      // Compute the name of the file to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(*j);
      std::string newName = this->Makefile->GetCurrentBinaryDirectory();
      newName += "/moc_";
      newName += srcName;
      newName += ".cxx";
      cmSourceFile* sf =
        this->Makefile->GetOrCreateSource(newName, true);
      if (curr)
        {
        sf->SetProperty("ABSTRACT", curr->GetProperty("ABSTRACT"));
        }

      // Compute the name of the header from which to generate the file.
      std::string hname;
      if(cmSystemTools::FileIsFullPath(j->c_str()))
        {
        hname = *j;
        }
      else
        {
        if(curr && curr->GetPropertyAsBool("GENERATED"))
          {
          hname = this->Makefile->GetCurrentBinaryDirectory();
          }
        else
          {
          hname = this->Makefile->GetCurrentSourceDirectory();
          }
        hname += "/";
        hname += *j;
        }

      // Append the generated source file to the list.
      if(!sourceListValue.empty())
        {
        sourceListValue += ";";
        }
      sourceListValue += newName;

      // Create the custom command to generate the file.
      cmCustomCommandLine commandLine;
      commandLine.push_back(moc_exe);
      commandLine.push_back("-o");
      commandLine.push_back(newName);
      commandLine.push_back(hname);

      cmCustomCommandLines commandLines;
      commandLines.push_back(commandLine);

      std::vector<std::string> depends;
      depends.push_back(moc_exe);
      depends.push_back(hname);

      std::string no_main_dependency = "";
      const char* no_working_dir = 0;
      this->Makefile->AddCustomCommandToOutput(newName,
                                               depends,
                                               no_main_dependency,
                                               commandLines,
                                               "Qt Wrapped File",
                                               no_working_dir);
      }
    }

  // Store the final list of source files.
  this->Makefile->AddDefinition(sourceList,
                                sourceListValue.c_str());
  return true;
}